

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
          (ExprComparator *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          e)

{
  int iVar1;
  bool bVar2;
  ExprBase *pEVar3;
  long lVar4;
  long lVar5;
  ExprBase *pEVar6;
  ExprBase *pEVar7;
  
  pEVar6 = *(ExprBase **)(this + 8);
  pEVar3 = (ExprBase *)0x0;
  if (*(int *)&pEVar6->impl_ - 0x2aU < 4) {
    pEVar3 = pEVar6;
  }
  lVar4 = (long)*(int *)((long)&pEVar3->impl_ + 4);
  pEVar7 = (ExprBase *)
           ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ + 8
           );
  iVar1 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                         impl_ + 4);
  if (lVar4 != 0) {
    lVar5 = (long)iVar1 * 8;
    do {
      if (lVar5 == 0) {
        return false;
      }
      pEVar6 = pEVar6 + 1;
      bVar2 = mp::Equal((Expr)pEVar6->impl_,(Expr)pEVar7->impl_);
      if (!bVar2) {
        return false;
      }
      pEVar7 = pEVar7 + 1;
      lVar5 = lVar5 + -8;
    } while (pEVar6 != pEVar3 + lVar4);
  }
  return pEVar7 == (ExprBase *)
                   ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                          impl_ + (long)iVar1 * 8 + 8);
}

Assistant:

bool ExprComparator::VisitVarArg(E e) {
  E vararg = Cast<E>(expr_);
  typename E::iterator i = vararg.begin(), iend = vararg.end();
  typename E::iterator j = e.begin(), jend = e.end();
  for (; i != iend; ++i, ++j) {
    if (j == jend || !Equal(*i, *j))
      return false;
  }
  return j == jend;
}